

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

int __thiscall jrtplib::RTPPacketBuilder::BuildPacket(RTPPacketBuilder *this,void *data,size_t len)

{
  int iVar1;
  
  iVar1 = -0x14;
  if ((((this->init == true) && (iVar1 = -0x11, this->defptset == true)) &&
      (iVar1 = -0x10, this->defmarkset == true)) && (iVar1 = -0x12, this->deftsset == true)) {
    iVar1 = PrivateBuildPacket(this,data,len,this->defaultpayloadtype,this->defaultmark,
                               this->defaulttimestampinc,false,0,(void *)0x0,0);
  }
  return iVar1;
}

Assistant:

int RTPPacketBuilder::BuildPacket(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!defptset)
		return ERR_RTP_PACKBUILD_DEFAULTPAYLOADTYPENOTSET;
	if (!defmarkset)
		return ERR_RTP_PACKBUILD_DEFAULTMARKNOTSET;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	return PrivateBuildPacket(data,len,defaultpayloadtype,defaultmark,defaulttimestampinc,false);
}